

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O2

IOStream * __thiscall
Assimp::DefaultIOSystem::Open(DefaultIOSystem *this,char *strFile,char *strMode)

{
  FILE *pFile;
  DefaultIOStream *this_00;
  allocator<char> local_39;
  string local_38;
  
  pFile = fopen(strFile,strMode);
  if (pFile == (FILE *)0x0) {
    this_00 = (DefaultIOStream *)0x0;
  }
  else {
    this_00 = (DefaultIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,strFile,&local_39);
    DefaultIOStream::DefaultIOStream(this_00,(FILE *)pFile,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return &this_00->super_IOStream;
}

Assistant:

IOStream* DefaultIOSystem::Open(const char* strFile, const char* strMode)
{
    ai_assert(strFile != nullptr);
    ai_assert(strMode != nullptr);
    FILE* file;
#ifdef _WIN32
    file = ::_wfopen(Utf8ToWide(strFile).c_str(), Utf8ToWide(strMode).c_str());
#else
    file = ::fopen(strFile, strMode);
#endif
    if (!file)
        return nullptr;

    return new DefaultIOStream(file, strFile);
}